

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O3

void checker_add_file(checker *checker,char *name,char *buffer,size_t len)

{
  int iVar1;
  archive_entry *entry;
  la_ssize_t lVar2;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'\x86',(uint)(entry != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(entry,"a");
  archive_entry_set_mode(entry,0x81ed);
  archive_entry_set_size(entry,(la_int64_t)buffer);
  iVar1 = archive_write_header(checker->short_archive,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                      ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_header(checker->short_archive, entry)",checker->short_archive);
  lVar2 = archive_write_data(checker->short_archive,name,(size_t)buffer);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                      ,L'\x8f',(longlong)buffer,"len",lVar2,
                      "archive_write_data(checker->short_archive, buffer, len)",
                      checker->short_archive);
  iVar1 = archive_write_header(checker->full_archive,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_header(checker->full_archive, entry)",checker->full_archive);
  lVar2 = archive_write_data(checker->full_archive,name,(size_t)buffer);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                      ,L'\x94',(longlong)buffer,"len",lVar2,
                      "archive_write_data(checker->full_archive, buffer, len)",checker->full_archive
                     );
  archive_entry_free(entry);
  return;
}

Assistant:

static void
checker_add_file(struct checker *checker, const char *name, char *buffer, size_t len)
{
        struct archive_entry *entry;
        assert((entry = archive_entry_new()) != NULL);

        archive_entry_set_pathname(entry, name);
        archive_entry_set_mode(entry, AE_IFREG | 0755);
        archive_entry_set_size(entry, len);

        assertEqualIntA(checker->short_archive, ARCHIVE_OK,
            archive_write_header(checker->short_archive, entry));
        assertEqualIntA(checker->short_archive, len,
            archive_write_data(checker->short_archive, buffer, len));

        assertEqualIntA(checker->full_archive, ARCHIVE_OK,
            archive_write_header(checker->full_archive, entry));
        assertEqualIntA(checker->full_archive, len,
            archive_write_data(checker->full_archive, buffer, len));

        archive_entry_free(entry);
}